

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_get_osfhandle_valid_handle(void)

{
  long *plVar1;
  int iVar2;
  uv_os_fd_t uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar4;
  __off64_t _Var5;
  uv_loop_t *puVar6;
  uv_buf_t uVar7;
  code *pcStackY_38;
  
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    run_test_get_osfhandle_valid_handle_cold_1();
LAB_00156f8c:
    run_test_get_osfhandle_valid_handle_cold_2();
LAB_00156f91:
    run_test_get_osfhandle_valid_handle_cold_3();
LAB_00156f96:
    run_test_get_osfhandle_valid_handle_cold_4();
LAB_00156f9b:
    run_test_get_osfhandle_valid_handle_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00156f8c;
    uv_fs_req_cleanup(&open_req1);
    uVar3 = uv_get_osfhandle((int)open_req1.result);
    if (uVar3 < 0) goto LAB_00156f91;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(int)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156f96;
    if (close_req.result != 0) goto LAB_00156f9b;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_get_osfhandle_valid_handle_cold_6();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    run_test_open_osfhandle_valid_handle_cold_1();
LAB_0015709d:
    run_test_open_osfhandle_valid_handle_cold_2();
LAB_001570a2:
    run_test_open_osfhandle_valid_handle_cold_3();
LAB_001570a7:
    run_test_open_osfhandle_valid_handle_cold_4();
LAB_001570ac:
    run_test_open_osfhandle_valid_handle_cold_5();
LAB_001570b1:
    run_test_open_osfhandle_valid_handle_cold_6();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015709d;
    uv_fs_req_cleanup(&open_req1);
    uVar3 = uv_get_osfhandle((int)open_req1.result);
    if (uVar3 < 0) goto LAB_001570a2;
    iVar2 = uv_open_osfhandle(uVar3);
    if (CONCAT44(open_req1.result._4_4_,(int)open_req1.result) != (long)iVar2) goto LAB_001570a7;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,iVar2,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001570ac;
    if (close_req.result != 0) goto LAB_001570b1;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_open_osfhandle_valid_handle_cold_7();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = uv_fs_open(loop,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 1) {
    run_test_fs_file_pos_after_op_with_offset_cold_1();
LAB_00157293:
    run_test_fs_file_pos_after_op_with_offset_cold_2();
LAB_00157298:
    run_test_fs_file_pos_after_op_with_offset_cold_3();
LAB_0015729d:
    run_test_fs_file_pos_after_op_with_offset_cold_4();
LAB_001572a2:
    run_test_fs_file_pos_after_op_with_offset_cold_5();
LAB_001572a7:
    run_test_fs_file_pos_after_op_with_offset_cold_6();
LAB_001572ac:
    run_test_fs_file_pos_after_op_with_offset_cold_7();
  }
  else {
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(int)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != 0xd) goto LAB_00157293;
    _Var5 = lseek64((int)open_req1.result,0,1);
    if (_Var5 != 0) goto LAB_00157298;
    uv_fs_req_cleanup(&write_req);
    uVar7 = uv_buf_init(buf,0x20);
    iov = uVar7;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(int)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != 0xd) goto LAB_0015729d;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_001572a2;
    _Var5 = lseek64((int)open_req1.result,0,1);
    if (_Var5 != 0) goto LAB_001572a7;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(int)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001572ac;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_fs_file_pos_after_op_with_offset_cold_8();
  pcStackY_38 = (code *)0x1572ca;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,0,(uv_fs_cb)0x0);
  if (iVar2 == -0x16) {
    pcStackY_38 = (code *)0x1572e0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001575e5;
    pcStackY_38 = (code *)0x157308;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_buf_t *)0x0,0,-1,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001575ea;
    pcStackY_38 = (code *)0x157330;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_buf_t *)0x0,0,-1,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001575ef;
    pcStackY_38 = (code *)0x157346;
    iVar2 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001575f4;
    pcStackY_38 = (code *)0x15735f;
    iVar2 = uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001575f9;
    pcStackY_38 = (code *)0x157375;
    iVar2 = uv_fs_mkdtemp((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001575fe;
    pcStackY_38 = (code *)0x15738b;
    iVar2 = uv_fs_mkstemp((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157603;
    pcStackY_38 = (code *)0x1573a1;
    iVar2 = uv_fs_rmdir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157608;
    pcStackY_38 = (code *)0x1573ba;
    iVar2 = uv_fs_scandir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015760d;
    pcStackY_38 = (code *)0x1573d3;
    iVar2 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157612;
    pcStackY_38 = (code *)0x1573ef;
    iVar2 = uv_fs_symlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157617;
    pcStackY_38 = (code *)0x157405;
    iVar2 = uv_fs_readlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015761c;
    pcStackY_38 = (code *)0x15741b;
    iVar2 = uv_fs_realpath((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157621;
    pcStackY_38 = (code *)0x157437;
    iVar2 = uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157626;
    pcStackY_38 = (code *)0x157453;
    iVar2 = uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015762b;
    pcStackY_38 = (code *)0x157469;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157630;
    pcStackY_38 = (code *)0x15747f;
    iVar2 = uv_fs_lstat((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157635;
    pcStackY_38 = (code *)0x157495;
    iVar2 = uv_fs_fstat((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015763a;
    pcStackY_38 = (code *)0x1574ae;
    iVar2 = uv_fs_rename((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015763f;
    pcStackY_38 = (code *)0x1574c4;
    iVar2 = uv_fs_fsync((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157644;
    pcStackY_38 = (code *)0x1574da;
    iVar2 = uv_fs_fdatasync((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157649;
    pcStackY_38 = (code *)0x1574f3;
    iVar2 = uv_fs_ftruncate((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015764e;
    pcStackY_38 = (code *)0x15750f;
    iVar2 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157653;
    pcStackY_38 = (code *)0x157533;
    iVar2 = uv_fs_sendfile((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157658;
    pcStackY_38 = (code *)0x15754c;
    iVar2 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015765d;
    pcStackY_38 = (code *)0x157565;
    iVar2 = uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157662;
    pcStackY_38 = (code *)0x15757e;
    iVar2 = uv_fs_fchmod((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157667;
    pcStackY_38 = (code *)0x15759a;
    iVar2 = uv_fs_utime((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0.0,0.0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015766c;
    pcStackY_38 = (code *)0x1575b6;
    iVar2 = uv_fs_futime((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0.0,0.0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157671;
    pcStackY_38 = (code *)0x1575cc;
    iVar2 = uv_fs_statfs((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 == -0x16) {
      pcStackY_38 = (code *)0x1575dc;
      uv_fs_req_cleanup((uv_fs_t *)0x0);
      return 0;
    }
  }
  else {
    pcStackY_38 = (code *)0x1575e5;
    run_test_fs_null_req_cold_1();
LAB_001575e5:
    pcStackY_38 = (code *)0x1575ea;
    run_test_fs_null_req_cold_2();
LAB_001575ea:
    pcStackY_38 = (code *)0x1575ef;
    run_test_fs_null_req_cold_3();
LAB_001575ef:
    pcStackY_38 = (code *)0x1575f4;
    run_test_fs_null_req_cold_4();
LAB_001575f4:
    pcStackY_38 = (code *)0x1575f9;
    run_test_fs_null_req_cold_5();
LAB_001575f9:
    pcStackY_38 = (code *)0x1575fe;
    run_test_fs_null_req_cold_6();
LAB_001575fe:
    pcStackY_38 = (code *)0x157603;
    run_test_fs_null_req_cold_7();
LAB_00157603:
    pcStackY_38 = (code *)0x157608;
    run_test_fs_null_req_cold_8();
LAB_00157608:
    pcStackY_38 = (code *)0x15760d;
    run_test_fs_null_req_cold_9();
LAB_0015760d:
    pcStackY_38 = (code *)0x157612;
    run_test_fs_null_req_cold_10();
LAB_00157612:
    pcStackY_38 = (code *)0x157617;
    run_test_fs_null_req_cold_11();
LAB_00157617:
    pcStackY_38 = (code *)0x15761c;
    run_test_fs_null_req_cold_12();
LAB_0015761c:
    pcStackY_38 = (code *)0x157621;
    run_test_fs_null_req_cold_13();
LAB_00157621:
    pcStackY_38 = (code *)0x157626;
    run_test_fs_null_req_cold_14();
LAB_00157626:
    pcStackY_38 = (code *)0x15762b;
    run_test_fs_null_req_cold_15();
LAB_0015762b:
    pcStackY_38 = (code *)0x157630;
    run_test_fs_null_req_cold_16();
LAB_00157630:
    pcStackY_38 = (code *)0x157635;
    run_test_fs_null_req_cold_17();
LAB_00157635:
    pcStackY_38 = (code *)0x15763a;
    run_test_fs_null_req_cold_18();
LAB_0015763a:
    pcStackY_38 = (code *)0x15763f;
    run_test_fs_null_req_cold_19();
LAB_0015763f:
    pcStackY_38 = (code *)0x157644;
    run_test_fs_null_req_cold_20();
LAB_00157644:
    pcStackY_38 = (code *)0x157649;
    run_test_fs_null_req_cold_21();
LAB_00157649:
    pcStackY_38 = (code *)0x15764e;
    run_test_fs_null_req_cold_22();
LAB_0015764e:
    pcStackY_38 = (code *)0x157653;
    run_test_fs_null_req_cold_23();
LAB_00157653:
    pcStackY_38 = (code *)0x157658;
    run_test_fs_null_req_cold_24();
LAB_00157658:
    pcStackY_38 = (code *)0x15765d;
    run_test_fs_null_req_cold_25();
LAB_0015765d:
    pcStackY_38 = (code *)0x157662;
    run_test_fs_null_req_cold_26();
LAB_00157662:
    pcStackY_38 = (code *)0x157667;
    run_test_fs_null_req_cold_27();
LAB_00157667:
    pcStackY_38 = (code *)0x15766c;
    run_test_fs_null_req_cold_28();
LAB_0015766c:
    pcStackY_38 = (code *)0x157671;
    run_test_fs_null_req_cold_29();
LAB_00157671:
    pcStackY_38 = (code *)0x157676;
    run_test_fs_null_req_cold_30();
  }
  pcStackY_38 = run_test_fs_statfs;
  run_test_fs_null_req_cold_31();
  puVar6 = (uv_loop_t *)&stack0xfffffffffffffe18;
  loop = uv_default_loop();
  puVar4 = (uv_loop_t *)0x0;
  iVar2 = uv_fs_statfs((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe18,".",(uv_fs_cb)0x0);
  if (iVar2 == 0) {
    statfs_cb((uv_fs_t *)&stack0xfffffffffffffe18);
    puVar4 = puVar6;
    if (statfs_cb_count != 1) goto LAB_001576fd;
    puVar4 = loop;
    iVar2 = uv_fs_statfs(loop,(uv_fs_t *)&stack0xfffffffffffffe18,".",statfs_cb);
    if (iVar2 != 0) goto LAB_00157702;
    puVar4 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (statfs_cb_count == 2) {
      return 0;
    }
  }
  else {
    run_test_fs_statfs_cold_1();
LAB_001576fd:
    run_test_fs_statfs_cold_2();
LAB_00157702:
    run_test_fs_statfs_cold_3();
  }
  run_test_fs_statfs_cold_4();
  if (puVar4->backend_fd == 0x22) {
    puVar6 = puVar4;
    if (puVar4->watcher_queue[0] != (void *)0x0) goto LAB_00157771;
    plVar1 = (long *)puVar4->watcher_queue[1];
    if (plVar1 == (long *)0x0) goto LAB_00157776;
    if (*plVar1 == 0) goto LAB_0015777b;
    if (plVar1[1] == 0) goto LAB_00157780;
    if (plVar1[2] == 0) goto LAB_00157785;
    if ((ulong)plVar1[2] < (ulong)plVar1[3]) goto LAB_0015778a;
    if ((ulong)plVar1[3] < (ulong)plVar1[4]) goto LAB_0015778f;
    if ((ulong)plVar1[6] <= (ulong)plVar1[5]) {
      uv_fs_req_cleanup((uv_fs_t *)puVar4);
      if (puVar4->watcher_queue[1] == (void *)0x0) {
        statfs_cb_count = statfs_cb_count + 1;
        return extraout_EAX;
      }
      goto LAB_00157799;
    }
  }
  else {
    statfs_cb_cold_1();
    puVar6 = puVar4;
LAB_00157771:
    statfs_cb_cold_2();
LAB_00157776:
    statfs_cb_cold_10();
LAB_0015777b:
    statfs_cb_cold_9();
LAB_00157780:
    statfs_cb_cold_8();
LAB_00157785:
    statfs_cb_cold_7();
LAB_0015778a:
    statfs_cb_cold_6();
LAB_0015778f:
    statfs_cb_cold_5();
  }
  statfs_cb_cold_4();
LAB_00157799:
  statfs_cb_cold_3();
  iVar2 = uv_is_closing((uv_handle_t *)puVar6);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(get_osfhandle_valid_handle) {
  int r;
  uv_os_fd_t fd;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  fd = uv_get_osfhandle(open_req1.result);
#ifdef _WIN32
  ASSERT(fd != INVALID_HANDLE_VALUE);
#else
  ASSERT(fd >= 0);
#endif

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup. */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}